

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  allocator local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)message_location;
  message_location_local = (LocationRecorder *)message;
  message_local = (DescriptorProto *)this;
  bVar1 = ConsumeEndOfDeclaration(this,"{",message_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = AtEnd(this);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"Reached end of input in message definition (missing \'}\')."
                   ,&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        return false;
      }
      bVar1 = ParseMessageStatement
                        (this,(DescriptorProto *)message_location_local,
                         (LocationRecorder *)containing_file_local,local_30);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    iVar2 = DescriptorProto::extension_range_size((DescriptorProto *)message_location_local);
    if (0 < iVar2) {
      anon_unknown_0::AdjustExtensionRangesWithMaxEndNumber
                ((DescriptorProto *)message_location_local);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  return true;
}